

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX.c
# Opt level: O0

uint32_t FAPOFX_CreateFXWithCustomAllocatorEXT
                   (FAudioGUID *clsid,FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                   FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                   FAudioReallocFunc customRealloc)

{
  int iVar1;
  uint32_t uVar2;
  FAudioReallocFunc in_RSI;
  FAudioFreeFunc in_RDI;
  uint32_t unaff_retaddr;
  FAudioReallocFunc in_stack_00000008;
  uint8_t in_stack_00000020;
  uint8_t in_stack_00000040;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXEQ,0x10);
  if (iVar1 == 0) {
    uVar2 = FAPOFXCreateEQ(pEffect,pInitData,InitDataByteSize,customMalloc,customFree,
                           in_stack_00000008,in_stack_00000040);
  }
  else {
    iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXEQ_LEGACY,0x10);
    if (iVar1 == 0) {
      uVar2 = FAPOFXCreateEQ(pEffect,pInitData,InitDataByteSize,customMalloc,customFree,
                             in_stack_00000008,in_stack_00000040);
    }
    else {
      iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXMasteringLimiter,0x10);
      if (iVar1 == 0) {
        uVar2 = FAPOFXCreateMasteringLimiter
                          ((FAPO **)customFree,in_stack_00000008,unaff_retaddr,
                           (FAudioMallocFunc)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI,in_stack_00000020);
      }
      else {
        iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXMasteringLimiter_LEGACY,0x10);
        if (iVar1 == 0) {
          uVar2 = FAPOFXCreateMasteringLimiter
                            ((FAPO **)customFree,in_stack_00000008,unaff_retaddr,
                             (FAudioMallocFunc)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             in_RSI,in_stack_00000020);
        }
        else {
          iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXReverb,0x10);
          if (iVar1 == 0) {
            uVar2 = FAPOFXCreateReverb((FAPO **)customFree,in_stack_00000008,unaff_retaddr,
                                       (FAudioMallocFunc)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,in_RDI,in_RSI,in_stack_00000020);
          }
          else {
            iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXReverb_LEGACY,0x10);
            if (iVar1 == 0) {
              uVar2 = FAPOFXCreateReverb((FAPO **)customFree,in_stack_00000008,unaff_retaddr,
                                         (FAudioMallocFunc)
                                         CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                         in_stack_00000020);
            }
            else {
              iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXEcho,0x10);
              if (iVar1 == 0) {
                uVar2 = FAPOFXCreateEcho((FAPO **)customFree,in_stack_00000008,unaff_retaddr,
                                         (FAudioMallocFunc)
                                         CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                         in_stack_00000020);
              }
              else {
                iVar1 = SDL_memcmp(in_RDI,&FAPOFX_CLSID_FXEcho_LEGACY,0x10);
                if (iVar1 == 0) {
                  uVar2 = FAPOFXCreateEcho((FAPO **)customFree,in_stack_00000008,unaff_retaddr,
                                           (FAudioMallocFunc)
                                           CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                           in_stack_00000020);
                }
                else {
                  uVar2 = 0xffffffff;
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

uint32_t FAPOFX_CreateFXWithCustomAllocatorEXT(
	const FAudioGUID *clsid,
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	#define CHECK_AND_RETURN(effect) \
		if (FAudio_memcmp(clsid, &FAPOFX_CLSID_FX##effect, sizeof(FAudioGUID)) == 0) \
		{ \
			return FAPOFXCreate##effect( \
				pEffect, \
				pInitData, \
				InitDataByteSize, \
				customMalloc, \
				customFree, \
				customRealloc, \
				0 \
			); \
		} \
		else if (FAudio_memcmp(clsid, &FAPOFX_CLSID_FX##effect##_LEGACY, sizeof(FAudioGUID)) == 0) \
		{ \
			return FAPOFXCreate##effect( \
				pEffect, \
				pInitData, \
				InitDataByteSize, \
				customMalloc, \
				customFree, \
				customRealloc, \
				1 \
			); \
		}
	CHECK_AND_RETURN(EQ)
	CHECK_AND_RETURN(MasteringLimiter)
	CHECK_AND_RETURN(Reverb)
	CHECK_AND_RETURN(Echo)
	#undef CHECK_AND_RETURN
	return -1;
}